

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RadiusDamageSelf
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  AActor *this;
  PClassActor *type;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  AActor *pAVar7;
  AActor *source;
  char *pcVar8;
  int damage;
  uint uVar9;
  bool bVar10;
  double dVar11;
  FName local_54;
  DAngle local_50;
  DVector3 local_48;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (this->super_DThinker).super_DObject.Class;
        bVar10 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar10) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar10 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c9930;
        }
      }
      if (numparam == 1) {
        pVVar5 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c994f:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x559,
                        "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar5 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar8 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003c994f;
        }
      }
      iVar3 = pVVar5[1].field_0.i;
      if (numparam < 3) {
        pVVar5 = defaultparam->Array;
        if (pVVar5[2].field_0.field_3.Type != '\x01') {
          pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003c996e;
        }
      }
      else {
        pVVar5 = param;
        if (param[2].field_0.field_3.Type != '\x01') {
          pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003c996e:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x55a,
                        "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      dVar1 = pVVar5[2].field_0.f;
      if (numparam < 4) {
        pVVar5 = defaultparam->Array;
        if (pVVar5[3].field_0.field_3.Type != '\0') {
          pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003c998d;
        }
      }
      else {
        pVVar5 = param;
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003c998d:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x55b,
                        "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      uVar9 = pVVar5[3].field_0.i;
      if (numparam < 5) {
        pVVar5 = defaultparam->Array;
        if ((pVVar5[4].field_0.field_3.Type == '\x03') &&
           ((pVVar6 = pVVar5 + 4, pVVar5[4].field_0.field_1.atag == 1 ||
            ((pVVar6->field_0).field_1.a == (void *)0x0)))) goto LAB_003c971f;
        pcVar8 = 
        "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
        ;
      }
      else {
        if ((param[4].field_0.field_3.Type == '\x03') &&
           ((pVVar6 = param + 4, param[4].field_0.field_1.atag == 1 ||
            ((pVVar6->field_0).field_1.a == (void *)0x0)))) {
LAB_003c971f:
          type = (PClassActor *)(pVVar6->field_0).field_1.a;
          pAVar7 = (this->target).field_0.p;
          if ((pAVar7 != (AActor *)0x0) &&
             (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->target).field_0.p = (AActor *)0x0;
            pAVar7 = (AActor *)0x0;
          }
          dVar11 = AActor::Distance3D(this,pAVar7,false);
          if (dVar11 < dVar1) {
            iVar3 = iVar3 - (int)((dVar11 * (double)iVar3) / dVar1);
            damage = iVar3;
            if (((uVar9 & 1) != 0) && (damage = 0, 0 < iVar3)) {
              do {
                uVar9 = FRandom::GenRand32(&pr_bfgselfdamage);
                damage = damage + (uVar9 & 7) + 1;
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
            uVar9 = 0;
            if (type == (PClassActor *)0x0) {
              pAVar7 = (AActor *)0x0;
            }
            else {
              pAVar7 = (this->target).field_0.p;
              if ((pAVar7 != (AActor *)0x0) &&
                 (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (this->target).field_0.p = (AActor *)0x0;
                pAVar7 = (AActor *)0x0;
              }
              local_48.Z = ((this->target).field_0.p)->Height * 0.25 + (pAVar7->__Pos).Z;
              local_48.X = (pAVar7->__Pos).X;
              local_48.Y = (pAVar7->__Pos).Y;
              pAVar7 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
            }
            if (pAVar7 == (AActor *)0x0) {
              local_54.Index = 200;
            }
            else {
              if (((pAVar7->flags5).Value & 0x800000) != 0) {
                (pAVar7->target).field_0 = (this->target).field_0;
              }
              uVar9 = (pAVar7->flags7).Value & 0x80 | (pAVar7->flags3).Value >> 0x13 & 0x40;
              local_54.Index = (pAVar7->DamageType).super_FName.Index;
            }
            pAVar7 = (this->target).field_0.p;
            if ((pAVar7 != (AActor *)0x0) &&
               (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->target).field_0.p = (AActor *)0x0;
              pAVar7 = (AActor *)0x0;
            }
            source = (this->target).field_0.p;
            if ((source != (AActor *)0x0) &&
               (((source->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->target).field_0.p = (AActor *)0x0;
              source = (AActor *)0x0;
            }
            local_50.Degrees = 0.0;
            iVar3 = P_DamageMobj(pAVar7,this,source,damage,&local_54,uVar9,&local_50);
            if (0 < iVar3) {
              damage = iVar3;
            }
            pAVar7 = (this->target).field_0.p;
            if ((pAVar7 != (AActor *)0x0) &&
               (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->target).field_0.p = (AActor *)0x0;
              pAVar7 = (AActor *)0x0;
            }
            P_TraceBleed(damage,pAVar7,this);
          }
          return 0;
        }
        pcVar8 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x55c,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c9930:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x558,
                "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusDamageSelf)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(damage);
	PARAM_FLOAT_DEF(distance);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(flashtype, AActor);

	int 				i;
	int 				damageSteps;
	int 				actualDamage;
	double 				actualDistance;

	actualDistance = self->Distance3D(self->target);
	if (actualDistance < distance)
	{
		// [XA] Decrease damage with distance. Use the BFG damage
		//      calculation formula if the flag is set (essentially
		//      a generalization of SMMU's BFG11K behavior, used
		//      with fraggle's blessing.)
		damageSteps = damage - int(damage * actualDistance / distance);
		if (flags & RDSF_BFGDAMAGE)
		{
			actualDamage = 0;
			for (i = 0; i < damageSteps; ++i)
				actualDamage += (pr_bfgselfdamage() & 7) + 1;
		}
		else
		{
			actualDamage = damageSteps;
		}

		// optional "flash" effect -- spawn an actor on
		// the player to indicate bad things happened.
		AActor *flash = NULL;
		if(flashtype != NULL)
			flash = Spawn(flashtype, self->target->PosPlusZ(self->target->Height / 4), ALLOW_REPLACE);

		int dmgFlags = 0;
		FName dmgType = NAME_BFGSplash;

		if (flash != NULL)
		{
			if (flash->flags5 & MF5_PUFFGETSOWNER) flash->target = self->target;
			if (flash->flags3 & MF3_FOILINVUL) dmgFlags |= DMG_FOILINVUL;
			if (flash->flags7 & MF7_FOILBUDDHA) dmgFlags |= DMG_FOILBUDDHA;
			dmgType = flash->DamageType;
		}

		int newdam = P_DamageMobj(self->target, self, self->target, actualDamage, dmgType, dmgFlags);
		P_TraceBleed(newdam > 0 ? newdam : actualDamage, self->target, self);
	}

	return 0;
}